

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O1

void cos1D_train<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj,int nTrain)

{
  double *__ptr;
  ostream *poVar1;
  undefined8 *puVar2;
  SrcEvaluatorType srcEvaluator;
  result_type_conflict1 rVar3;
  double dVar4;
  uniform_01<double,_double> uniform;
  unit_normal_distribution<double> impl;
  mt19937 rng;
  new_uniform_01<double> local_a11;
  double local_a10;
  DenseStorage<double,_1,_1,_1,_0> local_a08;
  double local_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  __ptr = (double *)malloc(8);
  if (__ptr != (double *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Training, y = cos(x), ",0x1c);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,nTrain);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," training points ---",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    *__ptr = 0.0;
    if (0 < nTrain) {
      do {
        rVar3 = boost::random::detail::new_uniform_01<double>::operator()(&local_a11,&local_9f8);
        dVar4 = rVar3 * 0.02 + *__ptr;
        *__ptr = dVar4;
        local_a10 = cos(dVar4);
        dVar4 = boost::random::detail::unit_normal_distribution<double>::operator()
                          ((unit_normal_distribution<double> *)&local_a00,&local_9f8);
        local_a08.m_data.array[0] = (plain_array<double,_1,_0,_0>)((dVar4 + 0.0) * 0.1 + local_a10);
        local_a00 = *__ptr;
        IMLE<1,_1,_FastLinearExpert>::update(imleObj,(Z *)&local_a00,(X *)&local_a08);
        *__ptr = (double)(~-(ulong)(12.566370614359172 < *__ptr) & (ulong)(*__ptr + 0.1));
        nTrain = nTrain + -1;
      } while (nTrain != 0);
    }
    free(__ptr);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void cos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
    cout << "\t --- Training, y = cos(x), " << nTrain << " training points ---" << endl;
    z[0] = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        z[0] += uniform(rng) * NOISE_Z;
        x[0] = cos(z[0]) + NOISE_X * normal(rng);

        imleObj.update(z,x);

        if( z[0] > 4*M_PI )
            z[0] = 0.0;
        else
            z[0] += 0.1;
    }
}